

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O1

FT_Error ps_builder_start_point(PS_Builder *builder,FT_Pos x,FT_Pos y)

{
  FT_Outline *pFVar1;
  FT_GlyphLoader loader;
  int iVar2;
  FT_Error FVar3;
  
  if (builder->path_begun != '\0') {
    return 0;
  }
  builder->path_begun = '\x01';
  pFVar1 = builder->current;
  if (pFVar1 == (FT_Outline *)0x0) {
    iVar2 = 3;
  }
  else {
    if (builder->load_points == '\0') {
      iVar2 = 0;
    }
    else {
      loader = builder->loader;
      iVar2 = 0;
      if (loader->max_contours <
          (int)(loader->current).outline.n_contours + (int)(loader->base).outline.n_contours + 1U) {
        iVar2 = FT_GlyphLoader_CheckPoints(loader,0,1);
      }
      if (iVar2 != 0) goto LAB_0020d1c2;
      if (0 < pFVar1->n_contours) {
        pFVar1->contours[(int)pFVar1->n_contours - 1] = pFVar1->n_points + -1;
      }
    }
    pFVar1->n_contours = pFVar1->n_contours + 1;
  }
LAB_0020d1c2:
  if (iVar2 != 0) {
    return iVar2;
  }
  FVar3 = ps_builder_add_point1(builder,x,y);
  return FVar3;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  ps_builder_start_point( PS_Builder*  builder,
                          FT_Pos       x,
                          FT_Pos       y )
  {
    FT_Error  error = FT_Err_Ok;


    /* test whether we are building a new contour */
    if ( !builder->path_begun )
    {
      builder->path_begun = 1;
      error = ps_builder_add_contour( builder );
      if ( !error )
        error = ps_builder_add_point1( builder, x, y );
    }

    return error;
  }